

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O2

char * google::protobuf::internal::TcParser::FastUnknownEnumFallback
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  uint uVar1;
  char *pcVar2;
  ushort *puVar3;
  ulong uVar4;
  uint *puVar5;
  ParseContext *extraout_RDX;
  ParseContext *ctx_00;
  uint32_t *out;
  uint32_t tag;
  
  out = &tag;
  pcVar2 = ReadTag(ptr,out,0);
  ctx_00 = extraout_RDX;
  if (pcVar2 == (char *)0x0) {
LAB_00263f29:
    pcVar2 = Error(msg,(char *)out,ctx_00,data,table,hasbits);
    return pcVar2;
  }
  data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)(long)*pcVar2;
  if ((long)data.field_0 < 0) {
    ctx_00 = (ParseContext *)((long)pcVar2[1] << 7 | 0x7f);
    if ((long)ctx_00 < 0) {
      out = (uint32_t *)((long)pcVar2[2] << 0xe | 0x3fff);
      if ((long)out < 0) {
        ctx_00 = (ParseContext *)((ulong)ctx_00 & ((long)pcVar2[3] << 0x15 | 0x1fffffU));
        if ((long)ctx_00 < 0) {
          out = (uint32_t *)((ulong)out & ((long)pcVar2[4] << 0x1c | 0xfffffffU));
          if ((long)out < 0) {
            ctx_00 = (ParseContext *)((ulong)ctx_00 & ((long)pcVar2[5] << 0x23 | 0x7ffffffffU));
            if ((long)ctx_00 < 0) {
              out = (uint32_t *)((ulong)out & ((long)pcVar2[6] << 0x2a | 0x3ffffffffffU));
              if ((long)out < 0) {
                ctx_00 = (ParseContext *)
                         ((ulong)ctx_00 & ((long)pcVar2[7] << 0x31 | 0x1ffffffffffffU));
                if ((long)ctx_00 < 0) {
                  out = (uint32_t *)
                        ((ulong)out & ((ulong)(byte)pcVar2[8] << 0x38 | 0xffffffffffffff));
                  if ((long)out < 0) {
                    puVar3 = (ushort *)(pcVar2 + 10);
                    if ((pcVar2[9] != '\x01') && (pcVar2[9] < '\0')) goto LAB_00263f29;
                  }
                  else {
                    puVar3 = (ushort *)(pcVar2 + 9);
                  }
                }
                else {
                  puVar3 = (ushort *)(pcVar2 + 8);
                }
              }
              else {
                puVar3 = (ushort *)(pcVar2 + 7);
              }
            }
            else {
              puVar3 = (ushort *)(pcVar2 + 6);
            }
          }
          else {
            puVar3 = (ushort *)(pcVar2 + 5);
          }
        }
        else {
          puVar3 = (ushort *)(pcVar2 + 4);
        }
      }
      else {
        puVar3 = (ushort *)(pcVar2 + 3);
      }
      ctx_00 = (ParseContext *)((ulong)ctx_00 & (ulong)out);
    }
    else {
      puVar3 = (ushort *)(pcVar2 + 2);
    }
    data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)((ulong)data.field_0 & (ulong)ctx_00);
  }
  else {
    puVar3 = (ushort *)(pcVar2 + 1);
  }
  AddUnknownEnum(msg,table,tag,SUB84(data.field_0.data,0));
  if ((ctx->super_EpsCopyInputStream).limit_end_ <= puVar3) {
    if ((ulong)table->has_bits_offset != 0) {
      puVar5 = RefAt<unsigned_int>(msg,(ulong)table->has_bits_offset);
      *puVar5 = *puVar5 | (uint)hasbits;
    }
    return (char *)puVar3;
  }
  uVar1 = (uint)table->fast_idx_mask & (uint)*puVar3;
  if ((uVar1 & 7) == 0) {
    uVar4 = (ulong)(uVar1 & 0xfffffff8);
    pcVar2 = (char *)(**(code **)(&table[1].has_bits_offset + uVar4))
                               (msg,puVar3,ctx,
                                (ulong)*puVar3 ^ *(ulong *)(&table[1].fast_idx_mask + uVar4 * 2),
                                table,hasbits);
    return pcVar2;
  }
  protobuf_assumption_failed
            ("(idx & 7) == 0",
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_impl.h"
             ,0x44d);
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastUnknownEnumFallback(
    PROTOBUF_TC_PARAM_DECL) {
  // Skip MiniParse/fallback and insert the element directly into the unknown
  // field set. We also normalize the value into an int32 as we do for known
  // enum values.
  uint32_t tag;
  ptr = ReadTag(ptr, &tag);
  if (PROTOBUF_PREDICT_FALSE(ptr == nullptr)) {
    PROTOBUF_MUSTTAIL return Error(PROTOBUF_TC_PARAM_NO_DATA_PASS);
  }
  uint64_t tmp;
  ptr = ParseVarint(ptr, &tmp);
  if (PROTOBUF_PREDICT_FALSE(ptr == nullptr)) {
    PROTOBUF_MUSTTAIL return Error(PROTOBUF_TC_PARAM_NO_DATA_PASS);
  }
  AddUnknownEnum(msg, table, tag, static_cast<int32_t>(tmp));
  PROTOBUF_MUSTTAIL return ToTagDispatch(PROTOBUF_TC_PARAM_NO_DATA_PASS);
}